

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

void P_NewChaseDir(AActor *actor)

{
  sector_t_conflict *psVar1;
  AWeapon *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  AActor *pAVar6;
  line_t_conflict *line;
  AActor *pAVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  uint uVar12;
  FBoundingBox box;
  FBlockLinesIterator it;
  double local_d8;
  double local_d0;
  undefined8 local_b8;
  FBoundingBox local_98;
  DVector3 local_78;
  int local_60;
  uint uStack_5c;
  int local_58;
  uint uStack_54;
  
  actor->strafecount = 0;
  if (((actor->flags5).Value & 0x80) == 0) {
    pAVar6 = (actor->target).field_0.p;
    if ((pAVar6 != (AActor *)0x0) &&
       (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (actor->target).field_0.p = (AActor *)0x0;
      pAVar6 = (AActor *)0x0;
    }
    pAVar7 = (actor->goal).field_0.p;
    if ((pAVar7 != (AActor *)0x0) &&
       (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (actor->goal).field_0.p = (AActor *)0x0;
      pAVar7 = (AActor *)0x0;
    }
    if (pAVar7 == pAVar6) goto LAB_003ee13f;
LAB_003ee19b:
    pAVar6 = (actor->target).field_0.p;
    if (pAVar6 == (AActor *)0x0) {
LAB_003ee5e1:
      Printf("P_NewChaseDir: called with no target\n");
      P_RandomChaseDir(actor);
      return;
    }
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->target).field_0.p = (AActor *)0x0;
      goto LAB_003ee5e1;
    }
    pAVar6 = (actor->target).field_0.p;
    if ((pAVar6 != (AActor *)0x0) &&
       (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (actor->target).field_0.p = (AActor *)0x0;
    }
    AActor::Vec2To((AActor *)&stack0xffffffffffffffa0,actor);
    iVar11 = local_60;
    uVar12 = uStack_5c;
    if ((((actor->flags6).Value & 0x10) == 0) &&
       (((((actor->target).field_0.p)->player != (player_t *)0x0 &&
         ((((actor->target).field_0.p)->player->cheats & 0x400) != 0)) ||
        (((actor->flags4).Value & 0x40000000) != 0)))) {
      uVar12 = uStack_5c ^ 0x80000000;
      uStack_54 = uStack_54 ^ 0x80000000;
    }
  }
  else {
LAB_003ee13f:
    pAVar6 = (actor->goal).field_0.p;
    if (pAVar6 == (AActor *)0x0) goto LAB_003ee19b;
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->goal).field_0.p = (AActor *)0x0;
      goto LAB_003ee19b;
    }
    pAVar6 = (actor->goal).field_0.p;
    if ((pAVar6 != (AActor *)0x0) &&
       (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (actor->goal).field_0.p = (AActor *)0x0;
    }
    AActor::Vec2To((AActor *)&stack0xffffffffffffffa0,actor);
    iVar11 = local_60;
    uVar12 = uStack_5c;
  }
  dVar9 = actor->floorz - actor->dropoffz;
  local_b8 = (double)CONCAT44(uStack_54,local_58);
  if (((actor->MaxDropOffHeight <= dVar9 && dVar9 != actor->MaxDropOffHeight) &&
      ((actor->__Pos).Z <= actor->floorz)) &&
     ((uVar5 = (actor->flags).Value, (uVar5 >> 10 & 1) == 0 &&
      (((uVar5 & 0x4000) == 0 && ((actor->flags2).Value & 0x800) == 0 &&
       ((i_compatflags._1_1_ & 0x40) == 0)))))) {
    local_98.m_Box[3] = (actor->__Pos).X;
    local_98.m_Box[1] = (actor->__Pos).Y;
    dVar9 = actor->radius;
    local_98.m_Box[0] = local_98.m_Box[1] + dVar9;
    local_98.m_Box[2] = local_98.m_Box[3] - dVar9;
    local_98.m_Box[3] = local_98.m_Box[3] + dVar9;
    local_98.m_Box[1] = local_98.m_Box[1] - dVar9;
    FBlockLinesIterator::FBlockLinesIterator
              ((FBlockLinesIterator *)&stack0xffffffffffffffa0,&local_98);
    line = FBlockLinesIterator::Next((FBlockLinesIterator *)&stack0xffffffffffffffa0);
    local_d8 = 0.0;
    local_d0 = 0.0;
    if (line != (line_t_conflict *)0x0) {
      local_d0 = 0.0;
      local_d8 = 0.0;
      do {
        if (((((line->backsector != (sector_t_conflict *)0x0) && (local_98.m_Box[2] < line->bbox[3])
              ) && (line->bbox[2] <= local_98.m_Box[3] && local_98.m_Box[3] != line->bbox[2])) &&
            ((line->bbox[1] <= local_98.m_Box[0] && local_98.m_Box[0] != line->bbox[1] &&
             (local_98.m_Box[1] < line->bbox[0])))) &&
           (iVar4 = FBoundingBox::BoxOnLineSide(&local_98,(line_t *)line), iVar4 == -1)) {
          psVar1 = line->frontsector;
          AActor::PosRelative(&local_78,actor,line);
          dVar10 = (local_78.Y * (psVar1->floorplane).normal.Y +
                   local_78.X * (psVar1->floorplane).normal.X + (psVar1->floorplane).D) *
                   (psVar1->floorplane).negiC;
          psVar1 = line->backsector;
          AActor::PosRelative(&local_78,actor,line);
          dVar8 = (local_78.Y * (psVar1->floorplane).normal.Y +
                  local_78.X * (psVar1->floorplane).normal.X + (psVar1->floorplane).D) *
                  (psVar1->floorplane).negiC;
          dVar9 = (actor->__Pos).Z;
          if (((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) ||
             (dVar9 - actor->MaxDropOffHeight <= dVar10)) {
            if (((dVar10 != dVar9) || (NAN(dVar10) || NAN(dVar9))) ||
               (dVar9 - actor->MaxDropOffHeight <= dVar8)) goto LAB_003ee519;
            dVar9 = c_atan2((line->delta).Y,(line->delta).X);
            dVar9 = dVar9 * 57.29577951308232 + 180.0;
          }
          else {
            dVar9 = c_atan2((line->delta).Y,(line->delta).X);
            dVar9 = dVar9 * 57.29577951308232;
          }
          dVar9 = FFastTrig::sin(&fasttrig,dVar9 * 11930464.711111112 + 6755399441055744.0);
          local_d0 = local_d0 - dVar9 * 32.0;
          dVar9 = FFastTrig::cos(&fasttrig,dVar9 * 32.0);
          local_d8 = local_d8 + dVar9 * 32.0;
        }
LAB_003ee519:
        line = FBlockLinesIterator::Next((FBlockLinesIterator *)&stack0xffffffffffffffa0);
      } while (line != (line_t_conflict *)0x0);
    }
    if (((local_d0 != 0.0) || (NAN(local_d0))) || ((local_d8 != 0.0 || (NAN(local_d8))))) {
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value | 0x20;
      P_DoNewChaseDir(actor,local_d0,local_d8);
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value & 0xdf;
      actor->movecount = 1;
      return;
    }
  }
  pAVar6 = (actor->target).field_0.p;
  if ((pAVar6 != (AActor *)0x0) &&
     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->target).field_0.p = (AActor *)0x0;
    pAVar6 = (AActor *)0x0;
  }
  if ((pAVar6->health < 1) || (bVar3 = AActor::IsFriend(actor,pAVar6), bVar3)) {
    dVar9 = (double)CONCAT44(uVar12,iVar11);
  }
  else {
    pAVar7 = (actor->goal).field_0.p;
    dVar9 = (double)CONCAT44(uVar12,iVar11);
    if ((pAVar7 != (AActor *)0x0) &&
       (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (actor->goal).field_0.p = (AActor *)0x0;
      pAVar7 = (AActor *)0x0;
    }
    if ((pAVar6 != pAVar7) && (((actor->flags3).Value & 0x800000) != 0)) {
      dVar10 = AActor::Distance2D(actor,pAVar6,false);
      if (pAVar6->player == (player_t *)0x0) {
        dVar9 = (double)CONCAT44(uVar12,iVar11);
        if (pAVar6->MissileState != (FState *)0x0) goto LAB_003ee5a0;
        dVar9 = pAVar6->meleerange + pAVar6->radius;
        bVar3 = dVar10 < dVar9 + dVar9;
      }
      else {
        pAVar2 = pAVar6->player->ReadyWeapon;
        dVar9 = (double)CONCAT44(uVar12,iVar11);
        if (pAVar2 == (AWeapon *)0x0) goto LAB_003ee5a0;
        bVar3 = (bool)(dVar10 < 192.0 &
                      (byte)(pAVar2->super_AStateProvider).super_AInventory.field_0x4fd >> 7);
      }
      dVar9 = (double)CONCAT44(uVar12,iVar11);
      if (bVar3 != false) {
        uVar5 = FRandom::GenRand32(&pr_enemystrafe);
        actor->strafecount = (ushort)uVar5 & 0xf;
        dVar9 = -(double)CONCAT44(uVar12,iVar11);
        local_b8 = -local_b8;
      }
    }
  }
LAB_003ee5a0:
  P_DoNewChaseDir(actor,dVar9,local_b8);
  if (actor->strafecount != 0) {
    actor->movecount = actor->strafecount;
  }
  return;
}

Assistant:

void P_NewChaseDir(AActor * actor)
{
	DVector2 delta;

	actor->strafecount = 0;

	if ((actor->flags5&MF5_CHASEGOAL || actor->goal == actor->target) && actor->goal!=NULL)
	{
		delta = actor->Vec2To(actor->goal);
	}
	else if (actor->target != NULL)
	{
		delta = actor->Vec2To(actor->target);

		if (!(actor->flags6 & MF6_NOFEAR))
		{
			if ((actor->target->player != NULL && (actor->target->player->cheats & CF_FRIGHTENING)) || 
				(actor->flags4 & MF4_FRIGHTENED))
			{
				delta = -delta;
			}
		}
	}
	else
	{
		// Don't abort if this happens.
		Printf ("P_NewChaseDir: called with no target\n");
		P_RandomChaseDir(actor);
		return;
	}
	
	// Try to move away from a dropoff
	if (actor->floorz - actor->dropoffz > actor->MaxDropOffHeight && 
		actor->Z() <= actor->floorz && !(actor->flags & MF_DROPOFF) && 
		!(actor->flags2 & MF2_ONMOBJ) &&
		!(actor->flags & MF_FLOAT) && !(i_compatflags & COMPATF_DROPOFF))
	{
		FBoundingBox box(actor->X(), actor->Y(), actor->radius);
		FBlockLinesIterator it(box);
		line_t *line;

		double deltax = 0;
		double deltay = 0;
		while ((line = it.Next()))
		{
			if (line->backsector  && // Ignore one-sided linedefs
				box.inRange(line) &&
				box.BoxOnLineSide(line) == -1)
		    {
				double front = line->frontsector->floorplane.ZatPoint(actor->PosRelative(line));
				double back  = line->backsector->floorplane.ZatPoint(actor->PosRelative(line));
				DAngle angle;
		
				// The monster must contact one of the two floors,
				// and the other must be a tall dropoff.
				
				if (back == actor->Z() && front < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle();   // front side dropoff
				}
				else if (front == actor->Z() && back < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle() + 180.; // back side dropoff
				}
				else continue;
		
				// Move away from dropoff at a standard speed.
				// Multiple contacted linedefs are cumulative (e.g. hanging over corner)
				deltax -= 32 * angle.Sin();
				deltay += 32 * angle.Cos();
			}
		}

		if (deltax != 0 || deltay != 0) 
		{
			// [Graf Zahl] I have changed P_TryMove to only apply this logic when
			// being called from here. AVOIDINGDROPOFF activates the code that
			// allows monsters to move away from a dropoff. This is different from
			// MBF which requires unconditional use of the altered logic and therefore
			// forcing a massive change in the monster behavior to use this.

			// use different dropoff movement logic in P_TryMove
			actor->flags5|=MF5_AVOIDINGDROPOFF;
			P_DoNewChaseDir(actor, deltax, deltay);
			actor->flags5&=~MF5_AVOIDINGDROPOFF;
		
			// If moving away from dropoff, set movecount to 1 so that 
			// small steps are taken to get monster away from dropoff.
			actor->movecount = 1;
			return;
		}
	}

#if 0
	// Move away from friends when too close, except
	// in certain situations (e.g. a crowded lift)

	// MBF code for friends. Cannot be done in ZDoom but left here as a reminder for later implementation.

	if (actor->flags & target->flags & MF_FRIEND &&
	    distfriend > dist && 
	    !P_IsOnLift(target) && !P_IsUnderDamage(actor))
	  deltax = -deltax, deltay = -deltay;
	else
#endif

	// MBF's monster_backing option. Made an actor flag instead. Also cleaned the code up to make it readable.
	// Todo: implement the movement logic
	AActor *target = actor->target;
	if (target->health > 0 && !actor->IsFriend(target) && target != actor->goal)
    {   // Live enemy target

		if (actor->flags3 & MF3_AVOIDMELEE)
		{
			bool ismeleeattacker = false;
			double dist = actor->Distance2D(target);
			if (target->player == NULL)
			{
				ismeleeattacker = (target->MissileState == NULL && dist < (target->meleerange + target->radius)*2);
			}
			else if (target->player->ReadyWeapon != NULL)
			{
				// melee range of player weapon is a parameter of the action function and cannot be checked here.
				// Add a new weapon property?
				ismeleeattacker = ((target->player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON) && dist < 192);
			}
			if (ismeleeattacker)
			{
				actor->strafecount = pr_enemystrafe() & 15;
				delta = -delta;
			}
	    }
	}

	P_DoNewChaseDir(actor, delta.X, delta.Y);

	// If strafing, set movecount to strafecount so that old Doom
	// logic still works the same, except in the strafing part

	if (actor->strafecount)
		actor->movecount = actor->strafecount;

}